

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

Symbol __thiscall
google::protobuf::DescriptorBuilder::LookupSymbolNoPlaceholder
          (DescriptorBuilder *this,string *name,string *relative_to,ResolveMode resolve_mode)

{
  pointer pcVar1;
  bool bVar2;
  Type TVar3;
  long lVar4;
  ulong uVar5;
  undefined8 uVar6;
  ulong unaff_RBP;
  anon_union_8_7_bfa3a334_for_Symbol_2 unaff_R12;
  Symbol SVar8;
  string scope_to_try;
  string first_part_of_name;
  string local_78;
  string local_58;
  ResolveMode local_34;
  anon_union_8_7_bfa3a334_for_Symbol_2 aVar7;
  
  this->possible_undeclared_dependency_ = (FileDescriptor *)0x0;
  local_34 = resolve_mode;
  if ((name->_M_string_length == 0) || (*(name->_M_dataplus)._M_p != '.')) {
    lVar4 = std::__cxx11::string::find((char)name,0x2e);
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    local_58._M_string_length = 0;
    local_58.field_2._M_local_buf[0] = '\0';
    if (lVar4 == -1) {
      std::__cxx11::string::_M_assign((string *)&local_58);
    }
    else {
      std::__cxx11::string::substr((ulong)&local_78,(ulong)name);
      std::__cxx11::string::operator=((string *)&local_58,(string *)&local_78);
      unaff_R12.descriptor = (Descriptor *)&local_78;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        unaff_R12.descriptor = (Descriptor *)&local_78;
      }
    }
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    pcVar1 = (relative_to->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_78,pcVar1,pcVar1 + relative_to->_M_string_length);
    do {
      uVar5 = std::__cxx11::string::rfind((char)&local_78,0x2e);
      if (uVar5 == 0xffffffffffffffff) {
        SVar8 = FindSymbol(this,name);
LAB_001d9e01:
        relative_to = (string *)(ulong)SVar8.type;
        bVar2 = false;
        uVar5 = unaff_RBP;
        aVar7 = SVar8.field_1;
      }
      else {
        if (local_78._M_string_length < uVar5) {
          std::__throw_out_of_range_fmt
                    ("%s: __pos (which is %zu) > this->size() (which is %zu)","basic_string::erase",
                     uVar5);
          goto LAB_001d9eb3;
        }
        local_78._M_dataplus._M_p[uVar5] = '\0';
        local_78._M_string_length = uVar5;
        std::__cxx11::string::_M_replace_aux((ulong)&local_78,uVar5,0,'\x01');
        std::__cxx11::string::_M_append((char *)&local_78,(ulong)local_58._M_dataplus._M_p);
        SVar8 = FindSymbol(this,&local_78);
        aVar7 = SVar8.field_1;
        TVar3 = SVar8.type;
        unaff_RBP = uVar5;
        if (TVar3 != NULL_SYMBOL) {
          if (local_58._M_string_length < name->_M_string_length) {
            if ((TVar3 - MESSAGE & 0xfffffff9) == 0) {
              std::__cxx11::string::append
                        ((string *)&local_78,(ulong)name,local_58._M_string_length);
              SVar8 = FindSymbol(this,&local_78);
              goto LAB_001d9e01;
            }
          }
          else if ((TVar3 & ~FIELD) == MESSAGE || local_34 != LOOKUP_TYPES) {
            bVar2 = false;
            relative_to = (string *)(SVar8._0_8_ & 0xffffffff);
            goto LAB_001d9e47;
          }
        }
        if (local_78._M_string_length < uVar5) {
LAB_001d9eb3:
          uVar6 = std::__throw_out_of_range_fmt
                            ("%s: __pos (which is %zu) > this->size() (which is %zu)",
                             "basic_string::erase",unaff_RBP);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p != &local_58.field_2) {
            operator_delete(local_58._M_dataplus._M_p,
                            CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                     local_58.field_2._M_local_buf[0]) + 1);
          }
          _Unwind_Resume(uVar6);
        }
        local_78._M_dataplus._M_p[uVar5] = '\0';
        bVar2 = true;
        aVar7 = unaff_R12;
        local_78._M_string_length = uVar5;
      }
LAB_001d9e47:
      unaff_RBP = uVar5;
      unaff_R12 = aVar7;
    } while (bVar2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    std::__cxx11::string::substr((ulong)&local_58,(ulong)name);
    SVar8 = FindSymbol(this,&local_58);
    aVar7 = SVar8.field_1;
    relative_to = (string *)(ulong)SVar8.type;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,
                    CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                             local_58.field_2._M_local_buf[0]) + 1);
  }
  SVar8._0_8_ = (ulong)relative_to & 0xffffffff;
  SVar8.field_1.descriptor = aVar7.descriptor;
  return SVar8;
}

Assistant:

Symbol DescriptorBuilder::LookupSymbolNoPlaceholder(
    const string& name, const string& relative_to, ResolveMode resolve_mode) {
  possible_undeclared_dependency_ = NULL;

  if (name.size() > 0 && name[0] == '.') {
    // Fully-qualified name.
    return FindSymbol(name.substr(1));
  }

  // If name is something like "Foo.Bar.baz", and symbols named "Foo" are
  // defined in multiple parent scopes, we only want to find "Bar.baz" in the
  // innermost one.  E.g., the following should produce an error:
  //   message Bar { message Baz {} }
  //   message Foo {
  //     message Bar {
  //     }
  //     optional Bar.Baz baz = 1;
  //   }
  // So, we look for just "Foo" first, then look for "Bar.baz" within it if
  // found.
  string::size_type name_dot_pos = name.find_first_of('.');
  string first_part_of_name;
  if (name_dot_pos == string::npos) {
    first_part_of_name = name;
  } else {
    first_part_of_name = name.substr(0, name_dot_pos);
  }

  string scope_to_try(relative_to);

  while (true) {
    // Chop off the last component of the scope.
    string::size_type dot_pos = scope_to_try.find_last_of('.');
    if (dot_pos == string::npos) {
      return FindSymbol(name);
    } else {
      scope_to_try.erase(dot_pos);
    }

    // Append ".first_part_of_name" and try to find.
    string::size_type old_size = scope_to_try.size();
    scope_to_try.append(1, '.');
    scope_to_try.append(first_part_of_name);
    Symbol result = FindSymbol(scope_to_try);
    if (!result.IsNull()) {
      if (first_part_of_name.size() < name.size()) {
        // name is a compound symbol, of which we only found the first part.
        // Now try to look up the rest of it.
        if (result.IsAggregate()) {
          scope_to_try.append(name, first_part_of_name.size(),
                              name.size() - first_part_of_name.size());
          return FindSymbol(scope_to_try);
        } else {
          // We found a symbol but it's not an aggregate.  Continue the loop.
        }
      } else {
        if (resolve_mode == LOOKUP_TYPES && !result.IsType()) {
          // We found a symbol but it's not a type.  Continue the loop.
        } else {
          return result;
        }
      }
    }

    // Not found.  Remove the name so we can try again.
    scope_to_try.erase(old_size);
  }
}